

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O0

CURLMcode mev_pollset_diff(Curl_multi *multi,Curl_easy *data,connectdata *conn,easy_pollset *ps,
                          easy_pollset *prev_ps)

{
  uint uVar1;
  bool bVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  undefined3 uVar7;
  _Bool _Var8;
  uint uVar9;
  CURLMcode CVar10;
  char *pcVar11;
  mev_sh_entry *e;
  size_t sVar12;
  ulong local_78;
  byte local_52;
  uchar local_51;
  _Bool stillused;
  _Bool first_time;
  uint uStack_4c;
  uchar last_action;
  CURLMcode mresult;
  uint j;
  uint i;
  curl_socket_t s;
  mev_sh_entry *entry;
  easy_pollset *prev_ps_local;
  easy_pollset *ps_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  for (mresult = CURLM_OK; (uint)mresult < ps->num; mresult = mresult + CURLM_BAD_HANDLE) {
    uVar1 = ps->sockets[(uint)mresult];
    _i = mev_sh_entry_get(&(multi->ev).sh_entries,uVar1);
    if (_i == (mev_sh_entry *)0x0) {
      local_52 = 1;
      _i = mev_sh_entry_add(&(multi->ev).sh_entries,uVar1);
      if (_i == (mev_sh_entry *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && (0 < Curl_trc_feat_multi.log_level)) {
        Curl_trc_multi(data,"ev new entry fd=%d",(ulong)uVar1);
      }
    }
    else {
      if (conn == (connectdata *)0x0) {
        _Var8 = mev_sh_entry_xfer_known(_i,data);
      }
      else {
        _Var8 = mev_sh_entry_conn_known(_i,conn);
      }
      local_52 = (_Var8 ^ 0xffU) & 1;
    }
    local_51 = '\0';
    if (local_52 == 0) {
      for (uStack_4c = 0; uStack_4c < prev_ps->num; uStack_4c = uStack_4c + 1) {
        if (uVar1 == prev_ps->sockets[uStack_4c]) {
          local_51 = prev_ps->actions[uStack_4c];
          break;
        }
      }
    }
    else {
      if (conn == (connectdata *)0x0) {
        _Var8 = mev_sh_entry_xfer_add(_i,data);
        if (!_Var8) {
          return CURLM_OUT_OF_MEMORY;
        }
      }
      else {
        _Var8 = mev_sh_entry_conn_add(_i,conn);
        if (!_Var8) {
          return CURLM_OUT_OF_MEMORY;
        }
      }
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && (0 < Curl_trc_feat_multi.log_level)) {
        pcVar11 = "transfer";
        if (conn == (connectdata *)0x0) {
          local_78 = (ulong)data->mid;
        }
        else {
          pcVar11 = "connection";
          local_78 = conn->connection_id;
        }
        uVar9 = Curl_uint_spbset_count(&_i->xfers);
        Curl_trc_multi(data,"ev entry fd=%d, added %s #%ld, total=%u/%d (xfer/conn)",(ulong)uVar1,
                       pcVar11,local_78,(ulong)uVar9,(uint)(_i->conn != (connectdata *)0x0));
      }
    }
    CVar10 = mev_sh_entry_update(multi,data,_i,uVar1,local_51,ps->actions[(uint)mresult]);
    if (CVar10 != CURLM_OK) {
      return CVar10;
    }
  }
  mresult = CURLM_OK;
  do {
    if (prev_ps->num <= (uint)mresult) {
      *(undefined8 *)prev_ps->sockets = *(undefined8 *)ps->sockets;
      *(undefined8 *)(prev_ps->sockets + 2) = *(undefined8 *)(ps->sockets + 2);
      *(undefined8 *)(prev_ps->sockets + 4) = *(undefined8 *)(ps->sockets + 4);
      uVar3 = ps->actions[1];
      uVar4 = ps->actions[2];
      uVar5 = ps->actions[3];
      uVar6 = ps->actions[4];
      uVar7 = *(undefined3 *)&ps->field_0x1d;
      prev_ps->actions[0] = ps->actions[0];
      prev_ps->actions[1] = uVar3;
      prev_ps->actions[2] = uVar4;
      prev_ps->actions[3] = uVar5;
      prev_ps->actions[4] = uVar6;
      *(undefined3 *)&prev_ps->field_0x1d = uVar7;
      return CURLM_OK;
    }
    bVar2 = false;
    uVar1 = prev_ps->sockets[(uint)mresult];
    for (uStack_4c = 0; uStack_4c < ps->num; uStack_4c = uStack_4c + 1) {
      if (uVar1 == ps->sockets[uStack_4c]) {
        bVar2 = true;
        break;
      }
    }
    if ((!bVar2) && (e = mev_sh_entry_get(&(multi->ev).sh_entries,uVar1), e != (mev_sh_entry *)0x0))
    {
      if ((conn == (connectdata *)0x0) || (_Var8 = mev_sh_entry_conn_remove(e,conn), _Var8)) {
        if ((conn != (connectdata *)0x0) || (_Var8 = mev_sh_entry_xfer_remove(e,data), _Var8)) {
          sVar12 = mev_sh_entry_user_count(e);
          if (sVar12 == 0) {
            CVar10 = mev_forget_socket(multi,data,uVar1,"last user gone");
            if (CVar10 != CURLM_OK) {
              return CVar10;
            }
          }
          else {
            CVar10 = mev_sh_entry_update(multi,data,e,uVar1,prev_ps->actions[(uint)mresult],'\0');
            if (CVar10 != CURLM_OK) {
              return CVar10;
            }
            if ((((data != (Curl_easy *)0x0) &&
                 ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
                (((data->state).feat == (curl_trc_feat *)0x0 ||
                 (0 < ((data->state).feat)->log_level)))) && (0 < Curl_trc_feat_multi.log_level)) {
              uVar9 = Curl_uint_spbset_count(&e->xfers);
              Curl_trc_multi(data,"ev entry fd=%d, removed transfer, total=%u/%d (xfer/conn)",
                             (ulong)uVar1,(ulong)uVar9,(ulong)(e->conn != (connectdata *)0x0));
            }
          }
        }
        else if (((data != (Curl_easy *)0x0) &&
                 ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
                ((((data->state).feat == (curl_trc_feat *)0x0 ||
                  (0 < ((data->state).feat)->log_level)) && (0 < Curl_trc_feat_multi.log_level)))) {
          Curl_trc_multi(data,"ev entry fd=%d, transfer lost interest but is not registered",
                         (ulong)uVar1);
        }
      }
      else if ((((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && (0 < Curl_trc_feat_multi.log_level)) {
        Curl_trc_multi(data,"ev entry fd=%d, conn lost interest but is not registered",(ulong)uVar1)
        ;
      }
    }
    mresult = mresult + CURLM_BAD_HANDLE;
  } while( true );
}

Assistant:

static CURLMcode mev_pollset_diff(struct Curl_multi *multi,
                                  struct Curl_easy *data,
                                  struct connectdata *conn,
                                  struct easy_pollset *ps,
                                  struct easy_pollset *prev_ps)
{
  struct mev_sh_entry *entry;
  curl_socket_t s;
  unsigned int i, j;
  CURLMcode mresult;

  /* The transfer `data` reports in `ps` the sockets it is interested
   * in and which combinatino of CURL_POLL_IN/CURL_POLL_OUT it wants
   * to have monitored for events.
   * There can be more than 1 transfer interested in the same socket
   * and 1 transfer might be interested in more than 1 socket.
   * `prev_ps` is the pollset copy from the previous call here. On
   * the 1st call it will be empty.
   */
  DEBUGASSERT(ps);
  DEBUGASSERT(prev_ps);

  /* Handle changes to sockets the transfer is interested in. */
  for(i = 0; i < ps->num; i++) {
    unsigned char last_action;
    bool first_time = FALSE; /* data/conn appears first time on socket */

    s = ps->sockets[i];
    /* Have we handled this socket before? */
    entry = mev_sh_entry_get(&multi->ev.sh_entries, s);
    if(!entry) {
      /* new socket, add new entry */
      first_time = TRUE;
      entry = mev_sh_entry_add(&multi->ev.sh_entries, s);
      if(!entry) /* fatal */
        return CURLM_OUT_OF_MEMORY;
      CURL_TRC_M(data, "ev new entry fd=%" FMT_SOCKET_T, s);
    }
    else if(conn) {
      first_time = !mev_sh_entry_conn_known(entry, conn);
    }
    else {
      first_time = !mev_sh_entry_xfer_known(entry, data);
    }

    /* What was the previous action the transfer had regarding this socket?
     * If the transfer is new to the socket, disregard the information
     * in `last_poll`, because the socket might have been destroyed and
     * reopened. We'd have cleared the sh_entry for that, but the socket
     * might still be mentioned in the hashed pollsets. */
    last_action = 0;
    if(first_time) {
      if(conn) {
        if(!mev_sh_entry_conn_add(entry, conn))
          return CURLM_OUT_OF_MEMORY;
      }
      else {
        if(!mev_sh_entry_xfer_add(entry, data))
          return CURLM_OUT_OF_MEMORY;
      }
      CURL_TRC_M(data, "ev entry fd=%" FMT_SOCKET_T ", added %s #%" FMT_OFF_T
                 ", total=%u/%d (xfer/conn)", s,
                 conn ? "connection" : "transfer",
                 conn ? conn->connection_id : data->mid,
                 Curl_uint_spbset_count(&entry->xfers),
                 entry->conn ? 1 : 0);
    }
    else {
      for(j = 0; j < prev_ps->num; j++) {
        if(s == prev_ps->sockets[j]) {
          last_action = prev_ps->actions[j];
          break;
        }
      }
    }
    /* track readers/writers changes and report to socket callback */
    mresult = mev_sh_entry_update(multi, data, entry, s,
                                  last_action, ps->actions[i]);
    if(mresult)
      return mresult;
  }

  /* Handle changes to sockets the transfer is NO LONGER interested in. */
  for(i = 0; i < prev_ps->num; i++) {
    bool stillused = FALSE;

    s = prev_ps->sockets[i];
    for(j = 0; j < ps->num; j++) {
      if(s == ps->sockets[j]) {
        /* socket is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = mev_sh_entry_get(&multi->ev.sh_entries, s);
    /* if entry does not exist, we were either never told about it or
     * have already cleaned up this socket via Curl_multi_ev_socket_done().
     * In other words: this is perfectly normal */
    if(!entry)
      continue;

    if(conn && !mev_sh_entry_conn_remove(entry, conn)) {
      /* `conn` says in `prev_ps` that it had been using a socket,
       * but `conn` has not been registered for it.
       * This should not happen if our book-keeping is correct? */
      CURL_TRC_M(data, "ev entry fd=%" FMT_SOCKET_T ", conn lost "
                 "interest but is not registered", s);
      DEBUGASSERT(NULL);
      continue;
    }

    if(!conn && !mev_sh_entry_xfer_remove(entry, data)) {
      /* `data` says in `prev_ps` that it had been using a socket,
       * but `data` has not been registered for it.
       * This should not happen if our book-keeping is correct? */
      CURL_TRC_M(data, "ev entry fd=%" FMT_SOCKET_T ", transfer lost "
                 "interest but is not registered", s);
      DEBUGASSERT(NULL);
      continue;
    }

    if(mev_sh_entry_user_count(entry)) {
      /* track readers/writers changes and report to socket callback */
      mresult = mev_sh_entry_update(multi, data, entry, s,
                                    prev_ps->actions[i], 0);
      if(mresult)
        return mresult;
      CURL_TRC_M(data, "ev entry fd=%" FMT_SOCKET_T ", removed transfer, "
                 "total=%u/%d (xfer/conn)", s,
                 Curl_uint_spbset_count(&entry->xfers),
                 entry->conn ? 1 : 0);
    }
    else {
      mresult = mev_forget_socket(multi, data, s, "last user gone");
      if(mresult)
        return mresult;
    }
  } /* for loop over num */

  /* Remember for next time */
  memcpy(prev_ps, ps, sizeof(*prev_ps));
  return CURLM_OK;
}